

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_scalar(upb_encstate *e,void *_field_mem,upb_MiniTableSubInternal *subs,
                  upb_MiniTableField *f)

{
  int *piVar1;
  byte bVar2;
  upb_TaggedMessagePtr uVar3;
  upb_MiniTable *puVar4;
  char *pcVar5;
  uint8_t wire_type;
  size_t in_RAX;
  uint uVar6;
  ulong uVar7;
  size_t size;
  
  switch(f->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
  case '\x06':
  case '\x10':
    encode_fixed64(e,*_field_mem);
    wire_type = '\x01';
    goto LAB_0024ec99;
  case '\x02':
  case '\a':
  case '\x0f':
    encode_fixed32(e,*_field_mem);
    wire_type = '\x05';
    goto LAB_0024ec99;
  case '\x03':
  case '\x04':
    uVar7 = *_field_mem;
    break;
  case '\x05':
  case '\x0e':
    uVar7 = (ulong)*_field_mem;
    break;
  case '\b':
    bVar2 = *_field_mem;
    uVar7 = (ulong)bVar2;
    pcVar5 = e->ptr;
    if (pcVar5 == e->buf) goto LAB_0024ec8f;
    e->ptr = pcVar5 + -1;
    pcVar5[-1] = bVar2;
    goto LAB_0024ec97;
  case '\t':
  case '\f':
    uVar7 = *(ulong *)((long)_field_mem + 8);
    encode_bytes(e,*_field_mem,uVar7);
    if ((uVar7 < 0x80) && (pcVar5 = e->ptr, pcVar5 != e->buf)) {
      e->ptr = pcVar5 + -1;
      pcVar5[-1] = (char)uVar7;
    }
    else {
      encode_longvarint(e,uVar7);
    }
    goto LAB_0024ec88;
  case '\n':
    uVar3 = *_field_mem;
    if (uVar3 == 0) {
      return;
    }
    puVar4 = *subs[f->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
LAB_0024ecb2:
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    encode_tag(e,f->number_dont_copy_me__upb_internal_use_only,'\x04');
    encode_TaggedMessagePtr(e,uVar3,puVar4,&size);
    e->depth = e->depth + 1;
    wire_type = '\x03';
    goto LAB_0024ec99;
  case '\v':
    uVar3 = *_field_mem;
    if (uVar3 == 0) {
      return;
    }
    puVar4 = *subs[f->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) goto LAB_0024ecb2;
    size = in_RAX;
    encode_TaggedMessagePtr(e,uVar3,puVar4,&size);
    if ((size < 0x80) && (pcVar5 = e->ptr, pcVar5 != e->buf)) {
      e->ptr = pcVar5 + -1;
      pcVar5[-1] = (char)size;
    }
    else {
      encode_longvarint(e,size);
    }
    e->depth = e->depth + 1;
LAB_0024ec88:
    wire_type = '\x02';
    goto LAB_0024ec99;
  case '\r':
    uVar7 = (ulong)*_field_mem;
    break;
  case '\x11':
    uVar6 = *_field_mem >> 0x1f ^ *_field_mem * 2;
    uVar7 = (ulong)uVar6;
    if (0x7f < uVar6) goto LAB_0024ec8f;
    goto LAB_0024ebdb;
  case '\x12':
    uVar7 = *_field_mem >> 0x3f ^ *_field_mem * 2;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                  ,0x137,
                  "void encode_scalar(upb_encstate *, const void *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  if (uVar7 < 0x80) {
LAB_0024ebdb:
    pcVar5 = e->ptr;
    if (pcVar5 == e->buf) goto LAB_0024ec8f;
    e->ptr = pcVar5 + -1;
    pcVar5[-1] = (char)uVar7;
  }
  else {
LAB_0024ec8f:
    encode_longvarint(e,uVar7);
  }
LAB_0024ec97:
  wire_type = '\0';
LAB_0024ec99:
  encode_tag(e,f->number_dont_copy_me__upb_internal_use_only,wire_type);
  return;
}

Assistant:

static void encode_scalar(upb_encstate* e, const void* _field_mem,
                          const upb_MiniTableSubInternal* subs,
                          const upb_MiniTableField* f) {
  const char* field_mem = _field_mem;
  int wire_type;

#define CASE(ctype, type, wtype, encodeval) \
  {                                         \
    ctype val = *(ctype*)field_mem;         \
    encode_##type(e, encodeval);            \
    wire_type = wtype;                      \
    break;                                  \
  }

  switch (f->UPB_PRIVATE(descriptortype)) {
    case kUpb_FieldType_Double:
      CASE(double, double, kUpb_WireType_64Bit, val);
    case kUpb_FieldType_Float:
      CASE(float, float, kUpb_WireType_32Bit, val);
    case kUpb_FieldType_Int64:
    case kUpb_FieldType_UInt64:
      CASE(uint64_t, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_UInt32:
      CASE(uint32_t, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_Int32:
    case kUpb_FieldType_Enum:
      CASE(int32_t, varint, kUpb_WireType_Varint, (int64_t)val);
    case kUpb_FieldType_SFixed64:
    case kUpb_FieldType_Fixed64:
      CASE(uint64_t, fixed64, kUpb_WireType_64Bit, val);
    case kUpb_FieldType_Fixed32:
    case kUpb_FieldType_SFixed32:
      CASE(uint32_t, fixed32, kUpb_WireType_32Bit, val);
    case kUpb_FieldType_Bool:
      CASE(bool, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_SInt32:
      CASE(int32_t, varint, kUpb_WireType_Varint, encode_zz32(val));
    case kUpb_FieldType_SInt64:
      CASE(int64_t, varint, kUpb_WireType_Varint, encode_zz64(val));
    case kUpb_FieldType_String:
    case kUpb_FieldType_Bytes: {
      upb_StringView view = *(upb_StringView*)field_mem;
      encode_bytes(e, view.data, view.size);
      encode_varint(e, view.size);
      wire_type = kUpb_WireType_Delimited;
      break;
    }
    case kUpb_FieldType_Group: {
      size_t size;
      upb_TaggedMessagePtr submsg = *(upb_TaggedMessagePtr*)field_mem;
      const upb_MiniTable* subm = _upb_Encoder_GetSubMiniTable(subs, f);
      if (submsg == 0) {
        return;
      }
      if (--e->depth == 0) encode_err(e, kUpb_EncodeStatus_MaxDepthExceeded);
      encode_tag(e, upb_MiniTableField_Number(f), kUpb_WireType_EndGroup);
      encode_TaggedMessagePtr(e, submsg, subm, &size);
      wire_type = kUpb_WireType_StartGroup;
      e->depth++;
      break;
    }
    case kUpb_FieldType_Message: {
      size_t size;
      upb_TaggedMessagePtr submsg = *(upb_TaggedMessagePtr*)field_mem;
      const upb_MiniTable* subm = _upb_Encoder_GetSubMiniTable(subs, f);
      if (submsg == 0) {
        return;
      }
      if (--e->depth == 0) encode_err(e, kUpb_EncodeStatus_MaxDepthExceeded);
      encode_TaggedMessagePtr(e, submsg, subm, &size);
      encode_varint(e, size);
      wire_type = kUpb_WireType_Delimited;
      e->depth++;
      break;
    }
    default:
      UPB_UNREACHABLE();
  }
#undef CASE

  encode_tag(e, upb_MiniTableField_Number(f), wire_type);
}